

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astcenc_entry.cpp
# Opt level: O1

astcenc_error astcenc_compress_cancel(astcenc_context *ctxo)

{
  astcenc_error aVar1;
  
  aVar1 = ASTCENC_ERR_BAD_CONTEXT;
  if (((ctxo->context).config.flags & 0x10) == 0) {
    LOCK();
    (ctxo->manage_compress).m_is_cancelled._M_base._M_i = true;
    UNLOCK();
    LOCK();
    (ctxo->manage_avg).m_is_cancelled._M_base._M_i = true;
    UNLOCK();
    aVar1 = ASTCENC_SUCCESS;
  }
  return aVar1;
}

Assistant:

astcenc_error astcenc_compress_cancel(
	astcenc_context* ctxo
) {
#if defined(ASTCENC_DECOMPRESS_ONLY)
	(void)ctxo;
	return ASTCENC_ERR_BAD_CONTEXT;
#else
	astcenc_contexti* ctx = &ctxo->context;
	if (ctx->config.flags & ASTCENC_FLG_DECOMPRESS_ONLY)
	{
		return ASTCENC_ERR_BAD_CONTEXT;
	}

	// Cancel compression before cancelling avg. This avoids the race condition
	// where cancelling them in the other order could see a compression worker
	// starting to process even though some of the avg data is undefined.
	ctxo->manage_compress.cancel();
	ctxo->manage_avg.cancel();
	return ASTCENC_SUCCESS;
#endif
}